

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
printOptionDiff(parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this,Option *O,StringRef V,
               OptionValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *D,size_t GlobalWidth)

{
  StringRef Str;
  bool bVar1;
  raw_ostream *prVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Str_00;
  uint local_68;
  size_t NumSpaces;
  size_t GlobalWidth_local;
  OptionValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *D_local;
  Option *O_local;
  parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  StringRef V_local;
  
  V_local.Data = (char *)V.Length;
  this_local = (parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)V.Data;
  basic_parser_impl::printOptionName((basic_parser_impl *)this,O,GlobalWidth);
  prVar2 = outs();
  prVar2 = raw_ostream::operator<<(prVar2,"= ");
  Str.Length = (size_t)V_local.Data;
  Str.Data = (char *)this_local;
  raw_ostream::operator<<(prVar2,Str);
  if (V_local.Data < (char *)0x8) {
    V_local.Length = (size_t)&this_local;
    local_68 = 8 - (int)V_local.Data;
  }
  else {
    local_68 = 0;
  }
  prVar2 = outs();
  prVar2 = raw_ostream::indent(prVar2,local_68);
  raw_ostream::operator<<(prVar2," (default: ");
  bVar1 = OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::hasValue(&D->
                      super_OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    );
  if (bVar1) {
    prVar2 = outs();
    Str_00 = OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::getValue(&D->
                         super_OptionValueCopy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       );
    raw_ostream::operator<<(prVar2,Str_00);
  }
  else {
    prVar2 = outs();
    raw_ostream::operator<<(prVar2,"*no default*");
  }
  prVar2 = outs();
  raw_ostream::operator<<(prVar2,")\n");
  return;
}

Assistant:

void parser<std::string>::printOptionDiff(const Option &O, StringRef V,
                                          const OptionValue<std::string> &D,
                                          size_t GlobalWidth) const {
  printOptionName(O, GlobalWidth);
  outs() << "= " << V;
  size_t NumSpaces = MaxOptWidth > V.size() ? MaxOptWidth - V.size() : 0;
  outs().indent(NumSpaces) << " (default: ";
  if (D.hasValue())
    outs() << D.getValue();
  else
    outs() << "*no default*";
  outs() << ")\n";
}